

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_path.c
# Opt level: O3

CURLcode Curl_getworkingpath(connectdata *conn,char *homedir,char **path)

{
  uint uVar1;
  ulong uVar2;
  CURLcode CVar3;
  size_t sVar4;
  char *__dest;
  short *__src;
  char *__dest_00;
  char *working_path;
  size_t working_path_len;
  short *local_30;
  ulong local_28;
  
  CVar3 = Curl_urldecode(conn->data,(conn->data->state).path,0,(char **)&local_30,&local_28,false);
  uVar2 = local_28;
  if (CVar3 != CURLE_OK) {
    return CVar3;
  }
  uVar1 = conn->handler->protocol;
  if ((uVar1 & 0x10) == 0) {
    if ((uVar1 & 0x20) == 0) {
      __dest = (char *)0x0;
      goto LAB_001428e0;
    }
    if ((local_28 < 2) || (*(char *)((long)local_30 + 1) != '~')) {
      __dest_00 = (char *)(*Curl_cmalloc)(local_28 + 1);
      __src = local_30;
      if (__dest_00 == (char *)0x0) goto LAB_001428f5;
      goto LAB_001428d5;
    }
    sVar4 = strlen(homedir);
    __dest = (char *)(*Curl_cmalloc)(uVar2 + sVar4 + 1);
    if (__dest == (char *)0x0) {
LAB_001428f5:
      (*Curl_cfree)(local_30);
      return CURLE_OUT_OF_MEMORY;
    }
    memcpy(__dest,homedir,sVar4);
    (__dest + sVar4)[0] = '/';
    (__dest + sVar4)[1] = '\0';
    if (local_28 < 4) goto LAB_001428e0;
    __dest_00 = __dest + sVar4 + 1;
    __src = (short *)((long)local_30 + 3);
    sVar4 = local_28 - 2;
  }
  else {
    __dest_00 = (char *)(*Curl_cmalloc)(local_28 + 1);
    if (__dest_00 == (char *)0x0) goto LAB_001428f5;
    __src = local_30;
    if ((3 < local_28) && ((char)local_30[1] == '/' && *local_30 == 0x7e2f)) {
      __src = (short *)((long)local_30 + 3);
    }
LAB_001428d5:
    sVar4 = local_28 + 1;
    __dest = __dest_00;
  }
  memcpy(__dest_00,__src,sVar4);
LAB_001428e0:
  (*Curl_cfree)(local_30);
  *path = __dest;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_getworkingpath(struct connectdata *conn,
                             char *homedir,  /* when SFTP is used */
                             char **path) /* returns the  allocated
                                             real path to work with */
{
  struct Curl_easy *data = conn->data;
  char *real_path = NULL;
  char *working_path;
  size_t working_path_len;
  CURLcode result =
    Curl_urldecode(data, data->state.path, 0, &working_path,
                   &working_path_len, FALSE);
  if(result)
    return result;

  /* Check for /~/, indicating relative to the user's home directory */
  if(conn->handler->protocol & CURLPROTO_SCP) {
    real_path = malloc(working_path_len + 1);
    if(real_path == NULL) {
      free(working_path);
      return CURLE_OUT_OF_MEMORY;
    }
    if((working_path_len > 3) && (!memcmp(working_path, "/~/", 3)))
      /* It is referenced to the home directory, so strip the leading '/~/' */
      memcpy(real_path, working_path + 3, 4 + working_path_len-3);
    else
      memcpy(real_path, working_path, 1 + working_path_len);
  }
  else if(conn->handler->protocol & CURLPROTO_SFTP) {
    if((working_path_len > 1) && (working_path[1] == '~')) {
      size_t homelen = strlen(homedir);
      real_path = malloc(homelen + working_path_len + 1);
      if(real_path == NULL) {
        free(working_path);
        return CURLE_OUT_OF_MEMORY;
      }
      /* It is referenced to the home directory, so strip the
         leading '/' */
      memcpy(real_path, homedir, homelen);
      real_path[homelen] = '/';
      real_path[homelen + 1] = '\0';
      if(working_path_len > 3) {
        memcpy(real_path + homelen + 1, working_path + 3,
               1 + working_path_len -3);
      }
    }
    else {
      real_path = malloc(working_path_len + 1);
      if(real_path == NULL) {
        free(working_path);
        return CURLE_OUT_OF_MEMORY;
      }
      memcpy(real_path, working_path, 1 + working_path_len);
    }
  }

  free(working_path);

  /* store the pointer for the caller to receive */
  *path = real_path;

  return CURLE_OK;
}